

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O3

void resampler_dup_inplace(void *_d,void *_s)

{
  undefined8 uVar1;
  
  uVar1 = *(undefined8 *)((long)_s + 8);
  *(undefined8 *)_d = *_s;
  *(undefined8 *)((long)_d + 8) = uVar1;
  *(undefined8 *)((long)_d + 0x10) = *(undefined8 *)((long)_s + 0x10);
  *(undefined8 *)((long)_d + 0x18) = *(undefined8 *)((long)_s + 0x18);
  *(undefined8 *)((long)_d + 0x20) = *(undefined8 *)((long)_s + 0x20);
  *(undefined8 *)((long)_d + 0x28) = *(undefined8 *)((long)_s + 0x28);
  *(undefined1 *)((long)_d + 0x30) = *(undefined1 *)((long)_s + 0x30);
  *(undefined1 *)((long)_d + 0x31) = *(undefined1 *)((long)_s + 0x31);
  *(undefined1 *)((long)_d + 0x32) = *(undefined1 *)((long)_s + 0x32);
  uVar1 = *(undefined8 *)((long)_s + 0x40);
  *(undefined8 *)((long)_d + 0x38) = *(undefined8 *)((long)_s + 0x38);
  *(undefined8 *)((long)_d + 0x40) = uVar1;
  memcpy((void *)((long)_d + 0x48),(void *)((long)_s + 0x48),0x200);
  memcpy((void *)((long)_d + 0x248),(void *)((long)_s + 0x248),0x17c);
  return;
}

Assistant:

void resampler_dup_inplace(void *_d, const void *_s)
{
    const resampler * r_in = ( const resampler * ) _s;
    resampler * r_out = ( resampler * ) _d;

    r_out->write_pos = r_in->write_pos;
    r_out->write_filled = r_in->write_filled;
    r_out->read_pos = r_in->read_pos;
    r_out->read_filled = r_in->read_filled;
    r_out->phase = r_in->phase;
    r_out->phase_inc = r_in->phase_inc;
    r_out->inv_phase = r_in->inv_phase;
    r_out->inv_phase_inc = r_in->inv_phase_inc;
    r_out->quality = r_in->quality;
    r_out->delay_added = r_in->delay_added;
    r_out->delay_removed = r_in->delay_removed;
    r_out->last_amp = r_in->last_amp;
    r_out->accumulator = r_in->accumulator;
    memcpy( r_out->buffer_in, r_in->buffer_in, sizeof(r_in->buffer_in) );
    memcpy( r_out->buffer_out, r_in->buffer_out, sizeof(r_in->buffer_out) );
}